

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int archive_write_set_format_mtree_default(archive *_a,char *fn)

{
  long lVar1;
  int iVar2;
  mtree_writer *mtree_00;
  archive *in_RDI;
  int magic_test;
  mtree_writer *mtree;
  archive_write *a;
  char *in_stack_00000068;
  uint in_stack_00000070;
  uint in_stack_00000074;
  archive *in_stack_00000078;
  int local_4;
  
  iVar2 = __archive_check_magic
                    (in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
  if (iVar2 == -0x1e) {
    local_4 = -0x1e;
  }
  else {
    lVar1._0_4_ = in_RDI[2].file_count;
    lVar1._4_4_ = in_RDI[2].archive_error_number;
    if (lVar1 != 0) {
      (**(code **)&in_RDI[2].file_count)(in_RDI);
    }
    mtree_00 = (mtree_writer *)calloc(1,0x100);
    if (mtree_00 == (mtree_writer *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate mtree data");
      local_4 = -0x1e;
    }
    else {
      mtree_00->mtree_entry = (mtree_entry_conflict *)0x0;
      mtree_00->first = 1;
      memset(&mtree_00->set,0,0x38);
      mtree_00->keys = 0x3d863a;
      mtree_00->dironly = 0;
      mtree_00->indent = 0;
      (mtree_00->ebuf).s = (char *)0x0;
      (mtree_00->ebuf).length = 0;
      (mtree_00->ebuf).buffer_length = 0;
      (mtree_00->buf).s = (char *)0x0;
      (mtree_00->buf).length = 0;
      (mtree_00->buf).buffer_length = 0;
      mtree_entry_register_init(mtree_00);
      *(mtree_writer **)&in_RDI[1].current_codepage = mtree_00;
      *(code **)&in_RDI[2].file_count = archive_write_mtree_free;
      in_RDI[1].sconv = (archive_string_conv *)0x1b1325;
      in_RDI[2].vtable = (archive_vtable_conflict *)archive_write_mtree_options;
      in_RDI[2].archive_format_name = (char *)archive_write_mtree_header;
      in_RDI[2].compression_name = (char *)archive_write_mtree_close;
      *(code **)&in_RDI[2].compression_code = archive_write_mtree_data;
      *(code **)&in_RDI[2].archive_format = archive_write_mtree_finish_entry;
      in_RDI->archive_format = 0x80000;
      in_RDI->archive_format_name = "mtree";
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
archive_write_set_format_mtree_default(struct archive *_a, const char *fn)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct mtree_writer *mtree;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC, ARCHIVE_STATE_NEW, fn);

	if (a->format_free != NULL)
		(a->format_free)(a);

	if ((mtree = calloc(1, sizeof(*mtree))) == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate mtree data");
		return (ARCHIVE_FATAL);
	}

	mtree->mtree_entry = NULL;
	mtree->first = 1;
	memset(&(mtree->set), 0, sizeof(mtree->set));
	mtree->keys = DEFAULT_KEYS;
	mtree->dironly = 0;
	mtree->indent = 0;
	archive_string_init(&mtree->ebuf);
	archive_string_init(&mtree->buf);
	mtree_entry_register_init(mtree);
	a->format_data = mtree;
	a->format_free = archive_write_mtree_free;
	a->format_name = "mtree";
	a->format_options = archive_write_mtree_options;
	a->format_write_header = archive_write_mtree_header;
	a->format_close = archive_write_mtree_close;
	a->format_write_data = archive_write_mtree_data;
	a->format_finish_entry = archive_write_mtree_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_MTREE;
	a->archive.archive_format_name = "mtree";

	return (ARCHIVE_OK);
}